

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

int __thiscall crnlib::mipmapped_texture::init(mipmapped_texture *this,EVP_PKEY_CTX *ctx)

{
  face_vec *this_00;
  component_flags cVar1;
  uint extraout_EAX;
  uint extraout_EAX_00;
  mipmapped_texture *pmVar2;
  void *pvVar3;
  mip_level *pmVar4;
  dxt_image *this_01;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_02;
  uint in_ECX;
  uint in_EDX;
  ulong uVar5;
  EVP_PKEY_CTX *ctx_00;
  uint in_R8D;
  pixel_format in_R9D;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  vector<crnlib::mip_level_*> *pvVar10;
  char *in_stack_00000008;
  orientation_flags_t in_stack_00000010;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  clear(this);
  this->m_width = (uint)ctx;
  this->m_height = in_EDX;
  cVar1 = pixel_format_helpers::get_component_flags(in_R9D);
  this->m_comp_flags = cVar1;
  this->m_format = in_R9D;
  if (in_stack_00000008 != (char *)0x0) {
    dynamic_string::set(&this->m_name,in_stack_00000008,0xffffffff);
  }
  this_00 = &this->m_faces;
  uVar9 = (this->m_faces).m_size;
  uVar8 = uVar9 - in_R8D;
  pmVar2 = (mipmapped_texture *)(ulong)uVar9;
  if (uVar8 != 0) {
    if (uVar9 < in_R8D || uVar8 == 0) {
      if ((this->m_faces).m_capacity < in_R8D) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,in_R8D,uVar9 + 1 == in_R8D,0x10,(object_mover)0x0,
                   false);
        uVar9 = (this->m_faces).m_size;
      }
      if (in_R8D - uVar9 != 0) {
        memset(this_00->m_p + uVar9,0,(ulong)(in_R8D - uVar9) << 4);
      }
    }
    else {
      pvVar10 = this_00->m_p;
      lVar6 = 0;
      do {
        pvVar3 = *(void **)((long)&pvVar10[in_R8D].m_p + lVar6);
        if (pvVar3 != (void *)0x0) {
          crnlib_free(pvVar3);
        }
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar6);
    }
    (this->m_faces).m_size = in_R8D;
    pmVar2 = this;
  }
  local_38 = (ulong)in_ECX;
  uVar9 = (uint)pmVar2;
  if (in_R8D != 0) {
    uVar7 = 0;
    local_48 = (ulong)in_R8D;
    do {
      uVar9 = this_00->m_p[uVar7].m_size;
      pvVar10 = this_00->m_p + uVar7;
      local_40 = uVar7;
      if (uVar9 != in_ECX) {
        if (uVar9 <= in_ECX) {
          if (pvVar10->m_capacity < in_ECX) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar10,in_ECX,uVar9 + 1 == in_ECX,8,(object_mover)0x0,
                       false);
            uVar9 = pvVar10->m_size;
          }
          pvVar3 = memset(pvVar10->m_p + uVar9,0,(ulong)(in_ECX - uVar9) << 3);
          uVar9 = (uint)pvVar3;
        }
        pvVar10->m_size = in_ECX;
      }
      if (in_ECX != 0) {
        uVar5 = 0;
        do {
          pmVar4 = (mip_level *)crnlib_malloc(0x28);
          pmVar4->m_width = 0;
          pmVar4->m_height = 0;
          pmVar4->m_comp_flags = cDefaultCompFlags;
          *(undefined8 *)&pmVar4->m_format = 0;
          *(undefined8 *)((long)&pmVar4->m_pImage + 4) = 0;
          *(undefined8 *)((long)&pmVar4->m_pDXTImage + 4) = 0;
          this_00->m_p[uVar7].m_p[uVar5] = pmVar4;
          uVar8 = (uint)ctx >> ((byte)uVar5 & 0x1f);
          uVar9 = in_EDX >> ((byte)uVar5 & 0x1f);
          if (0x41315843 < (int)in_R9D) {
            if ((int)in_R9D < 0x52784778) {
              if ((int)in_R9D < 0x52424741) {
                if ((in_R9D != PIXEL_FMT_DXT1A) && (in_R9D != PIXEL_FMT_ETC2A)) goto LAB_001324da;
              }
              else if ((in_R9D != PIXEL_FMT_DXT5_AGBR) && (in_R9D != PIXEL_FMT_DXT5_xGBR))
              goto LAB_001324da;
            }
            else if ((int)in_R9D < 0x53413245) {
              if ((in_R9D != PIXEL_FMT_DXT5_xGxR) && (in_R9D != PIXEL_FMT_ETC1S)) goto LAB_001324da;
            }
            else if ((in_R9D != PIXEL_FMT_ETC2AS) &&
                    ((in_R9D != PIXEL_FMT_DXT5_CCxY && (in_R9D != PIXEL_FMT_DXN))))
            goto LAB_001324da;
            goto LAB_0013233a;
          }
          if ((int)in_R9D < 0x32495441) {
            if ((int)in_R9D < 0x31545844) {
              if ((in_R9D != PIXEL_FMT_ETC1) && (in_R9D != PIXEL_FMT_DXT5A)) goto LAB_001324da;
            }
            else if ((in_R9D != PIXEL_FMT_DXT1) && (in_R9D != PIXEL_FMT_ETC2)) goto LAB_001324da;
LAB_0013233a:
            this_01 = (dxt_image *)crnlib_malloc(0x48);
            dxt_image::dxt_image(this_01);
            if ((int)in_R9D < 0x41315844) {
              if ((int)in_R9D < 0x32495441) {
                if ((int)in_R9D < 0x31545844) {
                  if (in_R9D == PIXEL_FMT_ETC1) {
                    ctx_00 = (EVP_PKEY_CTX *)0x7;
                  }
                  else {
                    if (in_R9D != PIXEL_FMT_DXT5A) goto LAB_00132568;
                    ctx_00 = (EVP_PKEY_CTX *)0x4;
                  }
                }
                else {
                  ctx_00 = (EVP_PKEY_CTX *)0x0;
                  if (in_R9D != PIXEL_FMT_DXT1) {
                    if (in_R9D != PIXEL_FMT_ETC2) goto LAB_00132568;
                    ctx_00 = (EVP_PKEY_CTX *)0x8;
                  }
                }
              }
              else if ((int)in_R9D < 0x33545844) {
                if (in_R9D != PIXEL_FMT_3DC) {
                  if (in_R9D == PIXEL_FMT_DXT2) goto LAB_0013246c;
                  goto LAB_00132568;
                }
                ctx_00 = (EVP_PKEY_CTX *)0x6;
              }
              else if (in_R9D == PIXEL_FMT_DXT3) {
LAB_0013246c:
                ctx_00 = (EVP_PKEY_CTX *)0x2;
              }
              else {
                if ((in_R9D == PIXEL_FMT_DXT4) || (in_R9D == PIXEL_FMT_DXT5)) goto LAB_0013248e;
LAB_00132568:
                ctx_00 = (EVP_PKEY_CTX *)0xffffffff;
              }
            }
            else if ((int)in_R9D < 0x52784778) {
              if (0x52424740 < (int)in_R9D) {
                if ((in_R9D == PIXEL_FMT_DXT5_AGBR) || (in_R9D == PIXEL_FMT_DXT5_xGBR))
                goto LAB_0013248e;
                goto LAB_00132568;
              }
              if (in_R9D == PIXEL_FMT_DXT1A) {
                ctx_00 = (EVP_PKEY_CTX *)0x1;
              }
              else {
                if (in_R9D != PIXEL_FMT_ETC2A) goto LAB_00132568;
                ctx_00 = (EVP_PKEY_CTX *)0x9;
              }
            }
            else if ((int)in_R9D < 0x53413245) {
              if (in_R9D == PIXEL_FMT_DXT5_xGxR) {
LAB_0013248e:
                ctx_00 = (EVP_PKEY_CTX *)0x3;
              }
              else {
                if (in_R9D != PIXEL_FMT_ETC1S) goto LAB_00132568;
                ctx_00 = (EVP_PKEY_CTX *)0xa;
              }
            }
            else if (in_R9D == PIXEL_FMT_ETC2AS) {
              ctx_00 = (EVP_PKEY_CTX *)0xb;
            }
            else {
              if (in_R9D != PIXEL_FMT_DXN) {
                if (in_R9D != PIXEL_FMT_DXT5_CCxY) goto LAB_00132568;
                goto LAB_0013248e;
              }
              ctx_00 = (EVP_PKEY_CTX *)0x5;
            }
            dxt_image::init(this_01,ctx_00);
            mip_level::assign((this->m_faces).m_p[uVar7].m_p[uVar5],this_01,this->m_format,
                              in_stack_00000010);
            uVar9 = extraout_EAX;
          }
          else {
            if ((int)in_R9D < 0x33545844) {
              if ((in_R9D != PIXEL_FMT_3DC) && (in_R9D != PIXEL_FMT_DXT2)) goto LAB_001324da;
              goto LAB_0013233a;
            }
            if ((in_R9D == PIXEL_FMT_DXT3) ||
               ((in_R9D == PIXEL_FMT_DXT4 || (in_R9D == PIXEL_FMT_DXT5)))) goto LAB_0013233a;
LAB_001324da:
            this_02 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
            local_4c.m_u32 = 0xff000000;
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      (this_02,uVar8 + (uVar8 == 0),uVar9 + (uVar9 == 0),0xffffffff,
                       (color_quad<unsigned_char,_int> *)&local_4c.field_0,0xf);
            this_02->m_comp_flags = this->m_comp_flags;
            mip_level::assign((this->m_faces).m_p[uVar7].m_p[uVar5],this_02,this->m_format,
                              in_stack_00000010);
            uVar9 = extraout_EAX_00;
          }
          uVar5 = uVar5 + 1;
        } while (local_38 != uVar5);
      }
      uVar7 = local_40 + 1;
    } while (uVar7 != local_48);
  }
  return uVar9;
}

Assistant:

void mipmapped_texture::init(uint width, uint height, uint levels, uint faces, pixel_format fmt, const char* pName, orientation_flags_t orient_flags) {
  clear();

  CRNLIB_ASSERT((width > 0) && (height > 0) && (levels > 0));
  CRNLIB_ASSERT((faces == 1) || (faces == 6));

  m_width = width;
  m_height = height;
  m_comp_flags = pixel_format_helpers::get_component_flags(fmt);
  m_format = fmt;
  if (pName)
    m_name.set(pName);

  m_faces.resize(faces);
  for (uint f = 0; f < faces; f++) {
    m_faces[f].resize(levels);
    for (uint l = 0; l < levels; l++) {
      m_faces[f][l] = crnlib_new<mip_level>();

      const uint mip_width = math::maximum(1U, width >> l);
      const uint mip_height = math::maximum(1U, height >> l);
      if (pixel_format_helpers::is_dxt(fmt)) {
        dxt_image* p = crnlib_new<dxt_image>();
        p->init(pixel_format_helpers::get_dxt_format(fmt), mip_width, mip_height, true);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      } else {
        image_u8* p = crnlib_new<image_u8>(mip_width, mip_height);
        p->set_comp_flags(m_comp_flags);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      }
    }
  }

  CRNLIB_ASSERT(check());
}